

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O2

uchar * nvpair_pack_string_array(nvpair_t *nvp,uchar *ptr,size_t *leftp)

{
  char **ppcVar1;
  size_t sVar2;
  char *pcVar3;
  ulong __n;
  size_t sVar4;
  uint uVar5;
  uchar *local_50;
  
  if (nvp == (nvpair_t *)0x0) {
    pcVar3 = "(nvp) != ((void*)0)";
  }
  else {
    if (nvp->nvp_magic == 0x6e7670) {
      if (nvp->nvp_type != 10) {
        __assert_fail("nvp->nvp_type == 10",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                      ,0x221,
                      "unsigned char *nvpair_pack_string_array(const nvpair_t *, unsigned char *, size_t *)"
                     );
      }
      if (nvp->nvp_datasize <= *leftp) {
        uVar5 = 0;
        ppcVar1 = nvpair_get_string_array(nvp,(size_t *)0x0);
        if (ppcVar1 == (char **)0x0) {
          __assert_fail("array != ((void*)0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                        ,0x226,
                        "unsigned char *nvpair_pack_string_array(const nvpair_t *, unsigned char *, size_t *)"
                       );
        }
        sVar4 = 0;
        local_50 = ptr;
        while( true ) {
          if (nvp->nvp_nitems <= (ulong)uVar5) {
            if (sVar4 == nvp->nvp_datasize) {
              return local_50;
            }
            __assert_fail("size == nvp->nvp_datasize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                          ,0x232,
                          "unsigned char *nvpair_pack_string_array(const nvpair_t *, unsigned char *, size_t *)"
                         );
          }
          pcVar3 = ppcVar1[uVar5];
          sVar2 = strlen(pcVar3);
          __n = sVar2 + 1;
          if (*leftp < __n) break;
          memcpy(local_50,pcVar3,__n);
          sVar4 = sVar4 + __n;
          local_50 = local_50 + __n;
          *leftp = *leftp - __n;
          uVar5 = uVar5 + 1;
        }
        __assert_fail("*leftp >= len",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                      ,0x22a,
                      "unsigned char *nvpair_pack_string_array(const nvpair_t *, unsigned char *, size_t *)"
                     );
      }
      __assert_fail("*leftp >= nvp->nvp_datasize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                    ,0x222,
                    "unsigned char *nvpair_pack_string_array(const nvpair_t *, unsigned char *, size_t *)"
                   );
    }
    pcVar3 = "(nvp)->nvp_magic == 0x6e7670";
  }
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                ,0x220,
                "unsigned char *nvpair_pack_string_array(const nvpair_t *, unsigned char *, size_t *)"
               );
}

Assistant:

unsigned char *
nvpair_pack_string_array(const nvpair_t *nvp, unsigned char *ptr, size_t *leftp)
{
	unsigned int ii;
	size_t size, len;
	const char * const *array;

	NVPAIR_ASSERT(nvp);
	PJDLOG_ASSERT(nvp->nvp_type == NV_TYPE_STRING_ARRAY);
	PJDLOG_ASSERT(*leftp >= nvp->nvp_datasize);

	size = 0;
	array = nvpair_get_string_array(nvp, NULL);
	PJDLOG_ASSERT(array != NULL);

	for (ii = 0; ii < nvp->nvp_nitems; ii++) {
		len = strlen(array[ii]) + 1;
		PJDLOG_ASSERT(*leftp >= len);

		memcpy(ptr, (const void *)array[ii], len);
		size += len;
		ptr += len;
		*leftp -= len;
	}

	PJDLOG_ASSERT(size == nvp->nvp_datasize);

	return (ptr);
}